

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O2

void ingest_info_cleanup(ingest_info_conflict *info)

{
  if ((FILE *)info->f != (FILE *)0x0) {
    fclose((FILE *)info->f);
  }
  if (info->header != (coda_mem_record *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->header);
  }
  if (info->records != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->records);
  }
  if (info->record != (coda_mem_record *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->record);
  }
  if (info->pos_clk_array != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->pos_clk_array);
  }
  if (info->pos_clk != (coda_mem_record *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->pos_clk);
  }
  if (info->vel_rate_array != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->vel_rate_array);
  }
  if (info->vel_rate != (coda_mem_record *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->vel_rate);
  }
  if (info->corr != (coda_mem_record *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->corr);
    return;
  }
  return;
}

Assistant:

static void ingest_info_cleanup(ingest_info *info)
{
    if (info->f != NULL)
    {
        fclose(info->f);
    }
    if (info->header != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->header);
    }
    satellite_info_cleanup(&info->gps);
    satellite_info_cleanup(&info->glonass);
    satellite_info_cleanup(&info->galileo);
    satellite_info_cleanup(&info->sbas);
    if (info->epoch_record_definition != NULL)
    {
        coda_type_release((coda_type *)info->epoch_record_definition);
    }
    if (info->sys_array != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->sys_array);
    }
    if (info->records != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->records);
    }
    if (info->epoch_record != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->epoch_record);
    }
    if (info->ionospheric_corr_array != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->ionospheric_corr_array);
    }
    if (info->time_system_corr_array != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->time_system_corr_array);
    }
}